

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void __thiscall so_5::environment_params_t::~environment_params_t(environment_params_t *this)

{
  std::_Function_base::~_Function_base(&(this->m_infrastructure_factory).super__Function_base);
  std::
  unique_ptr<so_5::queue_locks_defaults_manager_t,_std::default_delete<so_5::queue_locks_defaults_manager_t>_>
  ::~unique_ptr(&this->m_queue_locks_defaults_manager);
  std::_Function_base::~_Function_base
            ((_Function_base *)&(this->m_default_disp_params).m_queue_params);
  std::unique_ptr<so_5::msg_tracing::tracer_t,_std::default_delete<so_5::msg_tracing::tracer_t>_>::
  ~unique_ptr(&this->m_message_delivery_tracer);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->m_error_logger).
              super___shared_ptr<so_5::error_logger_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::
  unique_ptr<so_5::event_exception_logger_t,_std::default_delete<so_5::event_exception_logger_t>_>::
  ~unique_ptr(&this->m_event_exception_logger);
  std::unique_ptr<so_5::coop_listener_t,_std::default_delete<so_5::coop_listener_t>_>::~unique_ptr
            (&this->m_coop_listener);
  std::
  _Rb_tree<std::type_index,_std::pair<const_std::type_index,_std::shared_ptr<so_5::layer_t>_>,_std::_Select1st<std::pair<const_std::type_index,_std::shared_ptr<so_5::layer_t>_>_>,_std::less<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::shared_ptr<so_5::layer_t>_>_>_>
  ::~_Rb_tree(&(this->m_so_layers)._M_t);
  std::_Function_base::~_Function_base(&(this->m_timer_thread_factory).super__Function_base);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<so_5::dispatcher_t>_>_>_>
               *)this);
  return;
}

Assistant:

environment_params_t::~environment_params_t()
{
}